

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

int ghc::filesystem::copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  file_type fVar1;
  file_type fVar2;
  bool bVar3;
  file_type fVar4;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int iVar5;
  error_category *peVar6;
  file_status fVar7;
  undefined7 extraout_var;
  undefined7 uVar9;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  error_code *in_RCX;
  uint in_EDX;
  copy_options options;
  string *this;
  directory_entry *dst_00;
  directory_iterator iter;
  error_code tec;
  path local_90;
  directory_iterator local_70;
  error_code local_60;
  path local_50;
  ulong uVar8;
  
  local_60._M_value = 0;
  peVar6 = (error_category *)std::_V2::system_category();
  local_60._M_cat = peVar6;
  std::error_code::clear(in_RCX);
  if ((in_EDX & 0xb0) == 0) {
    fVar7 = status((filesystem *)&local_90,(path *)dst,in_RCX);
    fVar4 = fVar7._type;
  }
  else {
    fVar7 = symlink_status(&local_90,(error_code *)dst);
    fVar4 = fVar7._type;
  }
  fVar1 = (file_type)local_90._path._M_dataplus._M_p;
  if ((file_type)local_90._path._M_dataplus._M_p < regular) {
    if (in_RCX->_M_value != 0) {
      return fVar4;
    }
    in_RCX->_M_value = 2;
    goto LAB_0014be74;
  }
  if ((in_EDX & 0xa0) == 0) {
    fVar7 = status((filesystem *)&local_90,(path *)src,&local_60);
  }
  else {
    fVar7 = symlink_status(&local_90,(error_code *)src);
  }
  fVar2 = (file_type)local_90._path._M_dataplus._M_p;
  fVar4 = (file_type)CONCAT71(fVar7._1_7_,symlink < fVar1);
  if ((file_type)local_90._path._M_dataplus._M_p < block && symlink >= fVar1) {
    fVar4 = fVar1 ^ directory;
    uVar8 = (ulong)fVar4;
    if ((file_type)local_90._path._M_dataplus._M_p != regular || fVar4 != none) {
      if (not_found < (file_type)local_90._path._M_dataplus._M_p) {
        bVar3 = equivalent((path *)dst,(path *)src,in_RCX);
        uVar8 = CONCAT71(extraout_var,bVar3);
        fVar4 = (file_type)uVar8;
        if (bVar3) goto LAB_0014be6e;
      }
      fVar4 = (file_type)uVar8;
      options = (copy_options)in_EDX;
      if (fVar1 == regular) {
        if ((in_EDX & 0x40) != 0) {
          return fVar4;
        }
        if ((char)in_EDX < '\0') {
          bVar3 = path::has_root_directory((path *)dst);
          if (bVar3) {
            std::__cxx11::string::string((string *)&local_90,(string *)dst);
          }
          else {
            canonical(&local_90,(path *)dst,in_RCX);
          }
          this = (string *)&local_90;
          create_symlink((path *)this,(path *)src,in_RCX);
        }
        else {
          if ((in_EDX >> 8 & 1) != 0) {
            detail::create_hardlink((path *)dst,(path *)src,in_RCX);
            return extraout_EAX_01;
          }
          if (fVar2 != directory) {
            bVar3 = copy_file((path *)dst,(path *)src,options,in_RCX);
            return (int)CONCAT71(extraout_var_01,bVar3);
          }
          path::filename(&local_50,(path *)dst);
          operator/(&local_90,(path *)src,&local_50);
          copy_file((path *)dst,&local_90,options,in_RCX);
          std::__cxx11::string::~string((string *)&local_90);
          this = (string *)&local_50;
        }
        iVar5 = std::__cxx11::string::~string(this);
        return iVar5;
      }
      uVar9 = (undefined7)(uVar8 >> 8);
      if (fVar1 != symlink) {
        if (-1 < (char)in_EDX) {
          if (options != none && (in_EDX & 8) == 0) {
            return (int)CONCAT71(uVar9,options != none);
          }
          if (fVar2 < regular) {
            bVar3 = create_directory((path *)src,(path *)dst,in_RCX);
            if (in_RCX->_M_value != 0) {
              return (int)CONCAT71(extraout_var_00,bVar3);
            }
          }
          directory_iterator::directory_iterator(&local_70,(path *)dst,in_RCX);
          while( true ) {
            directory_iterator::directory_iterator((directory_iterator *)&local_90);
            bVar3 = std::operator!=(&((local_70._impl.
                                       super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->_current)._path,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(CONCAT44(local_90._path._M_dataplus._M_p._4_4_,
                                                 (file_type)local_90._path._M_dataplus._M_p) + 0x28)
                                   );
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &local_90._path._M_string_length);
            if ((!bVar3) || (in_RCX->_M_value != 0)) break;
            dst_00 = &(local_70._impl.
                       super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->_dir_entry;
            path::filename(&local_50,&dst_00->_path);
            operator/(&local_90,(path *)src,&local_50);
            copy((EVP_PKEY_CTX *)dst_00,(EVP_PKEY_CTX *)&local_90);
            std::__cxx11::string::~string((string *)&local_90);
            std::__cxx11::string::~string((string *)&local_50);
            if (in_RCX->_M_value != 0) break;
            directory_iterator::increment(&local_70,in_RCX);
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_70._impl.
                      super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          return extraout_EAX_00;
        }
        in_RCX->_M_value = 0x15;
        goto LAB_0014be74;
      }
      if ((in_EDX & 0x20) != 0) {
        return fVar4;
      }
      fVar4 = (file_type)CONCAT71(uVar9,not_found < fVar2);
      if ((in_EDX & 0x10) != 0 && not_found >= fVar2) {
        copy_symlink((path *)dst,(path *)src,in_RCX);
        return extraout_EAX;
      }
    }
  }
LAB_0014be6e:
  in_RCX->_M_value = 0x16;
LAB_0014be74:
  in_RCX->_M_cat = peVar6;
  return fVar4;
}

Assistant:

GHC_INLINE void copy(const path& from, const path& to, copy_options options, std::error_code& ec) noexcept
{
    std::error_code tec;
    file_status fs_from, fs_to;
    ec.clear();
    if ((options & (copy_options::skip_symlinks | copy_options::copy_symlinks | copy_options::create_symlinks)) != copy_options::none) {
        fs_from = symlink_status(from, ec);
    }
    else {
        fs_from = status(from, ec);
    }
    if (!exists(fs_from)) {
        if (!ec) {
            ec = detail::make_error_code(detail::portable_error::not_found);
        }
        return;
    }
    if ((options & (copy_options::skip_symlinks | copy_options::create_symlinks)) != copy_options::none) {
        fs_to = symlink_status(to, tec);
    }
    else {
        fs_to = status(to, tec);
    }
    if (is_other(fs_from) || is_other(fs_to) || (is_directory(fs_from) && is_regular_file(fs_to)) || (exists(fs_to) && equivalent(from, to, ec))) {
        ec = detail::make_error_code(detail::portable_error::invalid_argument);
    }
    else if (is_symlink(fs_from)) {
        if ((options & copy_options::skip_symlinks) == copy_options::none) {
            if (!exists(fs_to) && (options & copy_options::copy_symlinks) != copy_options::none) {
                copy_symlink(from, to, ec);
            }
            else {
                ec = detail::make_error_code(detail::portable_error::invalid_argument);
            }
        }
    }
    else if (is_regular_file(fs_from)) {
        if ((options & copy_options::directories_only) == copy_options::none) {
            if ((options & copy_options::create_symlinks) != copy_options::none) {
                create_symlink(from.is_absolute() ? from : canonical(from, ec), to, ec);
            }
            else if ((options & copy_options::create_hard_links) != copy_options::none) {
                create_hard_link(from, to, ec);
            }
            else if (is_directory(fs_to)) {
                copy_file(from, to / from.filename(), options, ec);
            }
            else {
                copy_file(from, to, options, ec);
            }
        }
    }
#ifdef LWG_2682_BEHAVIOUR
    else if (is_directory(fs_from) && (options & copy_options::create_symlinks) != copy_options::none) {
        ec = detail::make_error_code(detail::portable_error::is_a_directory);
    }
#endif
    else if (is_directory(fs_from) && (options == copy_options::none || (options & copy_options::recursive) != copy_options::none)) {
        if (!exists(fs_to)) {
            create_directory(to, from, ec);
            if (ec) {
                return;
            }
        }
        for (auto iter = directory_iterator(from, ec); iter != directory_iterator(); iter.increment(ec)) {
            if (!ec) {
                copy(iter->path(), to / iter->path().filename(), options | static_cast<copy_options>(0x8000), ec);
            }
            if (ec) {
                return;
            }
        }
    }
    return;
}